

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O1

void __thiscall musicBlock::OPLreleaseNote(musicBlock *this,uint channel,uchar note)

{
  byte bVar1;
  OPLio *this_00;
  channelEntry *pcVar2;
  ulong uVar3;
  
  this_00 = this->io;
  if (this_00->OPLchannels != 0) {
    bVar1 = (this->driverdata).channelSustain[channel];
    pcVar2 = this->channels;
    uVar3 = 0;
    do {
      if ((pcVar2->channel == channel) && (pcVar2->note == note)) {
        if (bVar1 < 0x40) {
          OPLio::OPLwriteFreq(this_00,(uint)uVar3,(uint)pcVar2->realnote,pcVar2->pitch,0);
          pcVar2->channel = pcVar2->channel | 0x80;
          pcVar2->time = this->MLtime;
          pcVar2->flags = 0x80;
        }
        else {
          pcVar2->flags = pcVar2->flags | 2;
        }
      }
      uVar3 = uVar3 + 1;
      this_00 = this->io;
      pcVar2 = pcVar2 + 1;
    } while (uVar3 < this_00->OPLchannels);
  }
  return;
}

Assistant:

void musicBlock::OPLreleaseNote(uint channel, uchar note)
{
	uint i;
	uint id = channel;
	uint sustain = driverdata.channelSustain[channel];

	for(i = 0; i < io->OPLchannels; i++)
	{
		if (channels[i].channel == id && channels[i].note == note)
		{
			if (sustain < 0x40)
				releaseChannel(i, 0);
			else
				channels[i].flags |= CH_SUSTAIN;
		}
	}
}